

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# once_test.c
# Opt level: O2

void benchmark_native_once(testing t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unique_lock<std::mutex> local_40;
  
  iVar1 = testing_n(t);
  for (iVar3 = 0; iVar3 != iVar1; iVar3 = iVar3 + 1) {
    if (nsync_pthread_once_(int*,void(*)())::cv == '\0') {
      iVar2 = __cxa_guard_acquire(&nsync_pthread_once_(int*,void(*)())::cv);
      if (iVar2 != 0) {
        std::condition_variable::condition_variable
                  ((condition_variable *)nsync_pthread_once_(int*,void(*)())::cv);
        __cxa_atexit(std::condition_variable::~condition_variable,
                     nsync_pthread_once_(int*,void(*)())::cv,&__dso_handle);
        __cxa_guard_release(&nsync_pthread_once_(int*,void(*)())::cv);
      }
    }
    local_40._M_device = (mutex_type *)nsync_pthread_once_(int*,void(*)())::mu;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    if (benchmark_native_once::o == 0) {
      benchmark_native_once::o = 1;
      std::unique_lock<std::mutex>::unlock(&local_40);
      std::unique_lock<std::mutex>::lock(&local_40);
      benchmark_native_once::o = 2;
      std::condition_variable::notify_all();
    }
    else {
      while (benchmark_native_once::o != 2) {
        std::condition_variable::wait((unique_lock *)nsync_pthread_once_(int*,void(*)())::cv);
      }
    }
    std::unique_lock<std::mutex>::unlock(&local_40);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  }
  return;
}

Assistant:

static void benchmark_native_once (testing t) {
	static pthread_once_t o = PTHREAD_ONCE_INIT;
	int n = testing_n (t);
	int i;
	for (i = 0; i != n; i++) {
		pthread_once (&o, &no_op);
	}
}